

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O1

string * __thiscall
front::syntax::SyntaxAnalyze::hp_gen_save_value_abi_cxx11_
          (string *__return_storage_ptr__,SyntaxAnalyze *this)

{
  ulong uVar1;
  uint __val;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  undefined8 *puVar6;
  long *plVar7;
  long *plVar8;
  uint uVar9;
  ulong uVar10;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  ulong local_a0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"$$","");
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + __return_storage_ptr__->_M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  __val = this->_genValueNum;
  cVar5 = '\x01';
  if (9 < __val) {
    uVar9 = __val;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar9 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_001aa77e;
      }
      if (uVar9 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_001aa77e;
      }
      if (uVar9 < 10000) goto LAB_001aa77e;
      bVar3 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_001aa77e:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,local_a8,__val);
  uVar1 = CONCAT44(uStack_a4,local_a8) + local_88;
  uVar10 = 0xf;
  if (local_90 != local_80) {
    uVar10 = local_80[0];
  }
  if (uVar10 < uVar1) {
    uVar10 = 0xf;
    if (local_b0 != local_a0) {
      uVar10 = local_a0[0];
    }
    if (uVar1 <= uVar10) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
      goto LAB_001aa801;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0);
LAB_001aa801:
  local_70 = &local_60;
  plVar7 = puVar6 + 2;
  if ((long *)*puVar6 == plVar7) {
    local_60 = *plVar7;
    uStack_58 = puVar6[3];
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*puVar6;
  }
  local_68 = puVar6[1];
  *puVar6 = plVar7;
  puVar6[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_40 = *plVar8;
    lStack_38 = plVar7[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar8;
    local_50 = (long *)*plVar7;
  }
  local_48 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  this->_genValueNum = this->_genValueNum + 1;
  return __return_storage_ptr__;
}

Assistant:

string SyntaxAnalyze::hp_gen_save_value() {
  string name = "$$";
  name = name + "__Compiler__gen__save__value__" + to_string(_genValueNum) +
         "__$$";
  _genValueNum++;
  return name;
}